

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O1

void __thiscall
slang::ast::AssertionInstanceExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (AssertionInstanceExpression *this,MonitorVisitor *visitor)

{
  size_type sVar1;
  pointer ppSVar2;
  DeclaredType *this_00;
  Expression *this_01;
  long lVar3;
  
  AssertionExpr::visit<slang::ast::builtins::MonitorVisitor>(this->body,visitor);
  sVar1 = (this->localVars).size_;
  if (sVar1 != 0) {
    ppSVar2 = (this->localVars).data_;
    lVar3 = 0;
    do {
      this_00 = Symbol::getDeclaredType(*(Symbol **)((long)ppSVar2 + lVar3));
      if (this_00 == (DeclaredType *)0x0) {
        assert::assertFailed
                  ("dt",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/expressions/MiscExpressions.h"
                   ,0xe4,
                   "void slang::ast::AssertionInstanceExpression::visitExprs(TVisitor &&) const [TVisitor = slang::ast::builtins::MonitorVisitor &]"
                  );
      }
      this_01 = DeclaredType::getInitializer(this_00);
      if (this_01 != (Expression *)0x0) {
        Expression::
        visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
                  (this_01,this_01,visitor);
      }
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        body.visit(visitor);
        for (auto sym : localVars) {
            auto dt = sym->getDeclaredType();
            ASSERT(dt);
            if (auto init = dt->getInitializer())
                init->visit(visitor);
        }
    }